

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O2

int fill_GOST_EC_params(EC_KEY *eckey,int nid)

{
  int iVar1;
  BN_CTX *ctx;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  EC_GROUP *group;
  EC_POINT *generator;
  R3410_ec_params *pRVar5;
  int iVar6;
  undefined1 auVar7 [16];
  BIGNUM *cofactor;
  BIGNUM *y;
  BIGNUM *x;
  BIGNUM *b;
  BIGNUM *a;
  BIGNUM *q;
  BIGNUM *p;
  EC_KEY *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  
  iVar1 = nid + -0x158;
  if (2 < nid - 0x4a0U) {
    iVar1 = nid;
  }
  for (pRVar5 = R3410_2012_512_paramset; pRVar5->nid != 0; pRVar5 = pRVar5 + 1) {
    if (pRVar5->nid == iVar1) goto LAB_0011cd31;
  }
  for (pRVar5 = R3410_2001_paramset; pRVar5->nid != 0; pRVar5 = pRVar5 + 1) {
    if (pRVar5->nid == iVar1) goto LAB_0011cd31;
  }
  pRVar5 = (R3410_ec_params *)0x0;
LAB_0011cd31:
  p = (BIGNUM *)0x0;
  q = (BIGNUM *)0x0;
  a = (BIGNUM *)0x0;
  b = (BIGNUM *)0x0;
  x = (BIGNUM *)0x0;
  y = (BIGNUM *)0x0;
  cofactor = (BIGNUM *)0x0;
  if (eckey == (EC_KEY *)0x0 || pRVar5 == (R3410_ec_params *)0x0) {
    iVar1 = 0x65;
    iVar6 = 0x83;
LAB_0011cdaa:
    ERR_GOST_error(0x66,iVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar1);
    return 0;
  }
  if ((EC_GROUP *)pRVar5->group == (EC_GROUP *)0x0) {
    iVar1 = nid;
    ctx = BN_CTX_new();
    if (ctx == (BN_CTX *)0x0) {
      iVar1 = 0x73;
      iVar6 = 0xc0100;
      goto LAB_0011cdaa;
    }
    local_50 = eckey;
    BN_CTX_start(ctx);
    p = (BIGNUM *)BN_CTX_get(ctx);
    local_38 = (BIGNUM *)p;
    a = (BIGNUM *)BN_CTX_get(ctx);
    local_40 = (BIGNUM *)a;
    b = (BIGNUM *)BN_CTX_get(ctx);
    local_48 = (BIGNUM *)b;
    pBVar2 = BN_CTX_get(ctx);
    x = (BIGNUM *)pBVar2;
    pBVar3 = BN_CTX_get(ctx);
    y = (BIGNUM *)pBVar3;
    pBVar4 = BN_CTX_get(ctx);
    q = (BIGNUM *)pBVar4;
    cofactor = (BIGNUM *)BN_CTX_get(ctx);
    auVar7._0_4_ = -(uint)((int)((ulong)local_38 >> 0x20) == 0 && (int)local_38 == 0);
    auVar7._4_4_ = -(uint)((int)local_40 == 0 && (int)((ulong)local_40 >> 0x20) == 0);
    auVar7._8_4_ = -(uint)((int)((ulong)local_48 >> 0x20) == 0 && (int)local_48 == 0);
    auVar7._12_4_ = -(uint)((int)pBVar2 == 0 && (int)((ulong)pBVar2 >> 0x20) == 0);
    iVar1 = movmskps(iVar1,auVar7);
    if (((pBVar4 == (BIGNUM *)0x0 || pBVar3 == (BIGNUM *)0x0) || iVar1 != 0) ||
        (BIGNUM *)cofactor == (BIGNUM *)0x0) {
      iVar6 = 0xc0100;
      iVar1 = 0x80;
    }
    else {
      iVar1 = BN_hex2bn((BIGNUM **)&p,pRVar5->p);
      if ((((iVar1 != 0) && (iVar1 = BN_hex2bn((BIGNUM **)&a,pRVar5->a), iVar1 != 0)) &&
          (iVar1 = BN_hex2bn((BIGNUM **)&b,pRVar5->b), iVar1 != 0)) &&
         (iVar1 = BN_hex2bn((BIGNUM **)&cofactor,pRVar5->cofactor), iVar1 != 0)) {
        group = EC_GROUP_new_curve_GFp((BIGNUM *)p,(BIGNUM *)a,(BIGNUM *)b,ctx);
        if (group == (EC_GROUP *)0x0) {
          iVar1 = 0x8e;
        }
        else {
          generator = EC_POINT_new(group);
          if (generator != (EC_POINT *)0x0) {
            iVar1 = BN_hex2bn((BIGNUM **)&x,pRVar5->x);
            if (((iVar1 == 0) || (iVar1 = BN_hex2bn((BIGNUM **)&y,pRVar5->y), iVar1 == 0)) ||
               ((iVar1 = EC_POINT_set_affine_coordinates(group,generator,x,y,ctx), iVar1 == 0 ||
                (iVar1 = BN_hex2bn((BIGNUM **)&q,pRVar5->q), iVar1 == 0)))) {
              iVar1 = 0x9c;
            }
            else {
              iVar1 = EC_GROUP_set_generator(group,generator,(BIGNUM *)q,(BIGNUM *)cofactor);
              if (iVar1 == 0) {
                iVar1 = 0xa1;
              }
              else {
                EC_GROUP_set_curve_name(group,nid);
                pRVar5->group = (EC_GROUP *)group;
                iVar1 = EC_KEY_set_group((EC_KEY *)local_50,group);
                if (iVar1 != 0) {
                  iVar1 = 1;
                  goto LAB_0011d05a;
                }
                iVar1 = 0xa7;
              }
            }
            ERR_GOST_error(0x66,0xc0103,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                           ,iVar1);
            goto LAB_0011d006;
          }
          iVar1 = 0x94;
        }
        ERR_GOST_error(0x66,0xc0100,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                       ,iVar1);
        generator = (EC_POINT *)0x0;
        goto LAB_0011d006;
      }
      iVar6 = 0xc0103;
      iVar1 = 0x88;
    }
    ERR_GOST_error(0x66,iVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,iVar1);
    generator = (EC_POINT *)0x0;
    iVar1 = 0;
  }
  else {
    EC_GROUP_set_curve_name((EC_GROUP *)pRVar5->group,nid);
    iVar1 = EC_KEY_set_group((EC_KEY *)eckey,(EC_GROUP *)pRVar5->group);
    if (iVar1 != 0) {
      return 1;
    }
    ERR_GOST_error(0x66,0xc0103,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                   ,0x6c);
    generator = (EC_POINT *)0x0;
    ctx = (BN_CTX *)0x0;
LAB_0011d006:
    iVar1 = 0;
  }
LAB_0011d05a:
  EC_POINT_free(generator);
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  return iVar1;
}

Assistant:

int fill_GOST_EC_params(EC_KEY *eckey, int nid)
{
    R3410_ec_params *params = gost_nid2params(nid);
    EC_GROUP *grp = NULL;
    EC_POINT *P = NULL;
    BIGNUM *p = NULL, *q = NULL, *a = NULL, *b = NULL, *x = NULL, *y =
        NULL, *cofactor = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!eckey || !params) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, GOST_R_UNSUPPORTED_PARAMETER_SET);
        return 0;
    }

    if (params->group) {
        EC_GROUP_set_curve_name(params->group, nid);
        if (!EC_KEY_set_group(eckey, params->group)) {
            GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
            goto end;
        }
        return 1;
    }

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    p = BN_CTX_get(ctx);
    a = BN_CTX_get(ctx);
    b = BN_CTX_get(ctx);
    x = BN_CTX_get(ctx);
    y = BN_CTX_get(ctx);
    q = BN_CTX_get(ctx);
    cofactor = BN_CTX_get(ctx);
    if (!p || !a || !b || !x || !y || !q || !cofactor) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&p, params->p)
        || !BN_hex2bn(&a, params->a)
        || !BN_hex2bn(&b, params->b)
        || !BN_hex2bn(&cofactor, params->cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    grp = EC_GROUP_new_curve_GFp(p, a, b, ctx);
    if (!grp) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    P = EC_POINT_new(grp);
    if (!P) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&x, params->x)
        || !BN_hex2bn(&y, params->y)
        || !EC_POINT_set_affine_coordinates(grp, P, x, y, ctx)
        || !BN_hex2bn(&q, params->q)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    if (!EC_GROUP_set_generator(grp, P, q, cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    EC_GROUP_set_curve_name(grp, nid);
    params->group = grp;
    if (!EC_KEY_set_group(eckey, grp)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    ok = 1;
 end:
    EC_POINT_free(P);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}